

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polygon.h
# Opt level: O1

Vector __thiscall anurbs::Polygon::vertex(Polygon *this,Index index)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *path;
  long *plVar4;
  undefined8 *puVar5;
  long in_RDX;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double in_XMM1_Qa;
  Vector VVar10;
  
  lVar7 = *(long *)(index + 8) - *(long *)index >> 4;
  if (in_RDX < lVar7) {
    puVar1 = (undefined4 *)(*(long *)index + in_RDX * 0x10);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    uVar2 = puVar1[2];
    uVar3 = puVar1[3];
    *(undefined4 *)
     &(this->outer_path).
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start = uVar8;
    *(undefined4 *)
     ((long)&(this->outer_path).
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = uVar9;
    *(undefined4 *)
     &(this->outer_path).
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = uVar2;
    *(undefined4 *)
     ((long)&(this->outer_path).
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar3;
  }
  else {
    plVar4 = *(long **)(index + 0x18);
    while( true ) {
      if (plVar4 == *(long **)(index + 0x20)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = &__cxxabiv1::__pointer_type_info::vtable;
        __cxa_throw(puVar5,&std::exception::typeinfo,std::exception::~exception);
      }
      lVar6 = (plVar4[1] - *plVar4 >> 4) + lVar7;
      if (in_RDX < lVar6) break;
      plVar4 = plVar4 + 3;
      lVar7 = lVar6;
    }
    puVar1 = (undefined4 *)(*plVar4 + (in_RDX - lVar7) * 0x10);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    uVar2 = puVar1[2];
    uVar3 = puVar1[3];
    *(undefined4 *)
     &(this->outer_path).
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start = uVar8;
    *(undefined4 *)
     ((long)&(this->outer_path).
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = uVar9;
    *(undefined4 *)
     &(this->outer_path).
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = uVar2;
    *(undefined4 *)
     ((long)&(this->outer_path).
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar3;
  }
  VVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0].
  _4_4_ = uVar9;
  VVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0].
  _0_4_ = uVar8;
  VVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  return (Vector)VVar10.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                 m_data.array;
}

Assistant:

Vector vertex(Index index) const
    {
        if (index < length(outer_path)) {
            return outer_path[index];
        }

        Index offset = length(outer_path);

        for (const auto& path : inner_paths) {
            if (index < offset + length(path)) {
                return path[index - offset];
            }

            offset += length(path);
        }

        throw std::exception();
    }